

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O1

wchar_t fl_utf8locale(void)

{
  wchar_t wVar1;
  char *pcVar2;
  char *pcVar3;
  
  wVar1 = fl_utf8locale::ret;
  if (fl_utf8locale::ret == L'\x02') {
    fl_utf8locale::ret = L'\x01';
    pcVar2 = getenv("LC_CTYPE");
    if ((((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) ||
        ((pcVar2 = getenv("LC_ALL"), pcVar2 != (char *)0x0 && (*pcVar2 != '\0')))) ||
       ((pcVar2 = getenv("LANG"), wVar1 = fl_utf8locale::ret, pcVar2 != (char *)0x0 &&
        (*pcVar2 != '\0')))) {
      pcVar3 = strstr(pcVar2,"utf");
      wVar1 = L'\x01';
      if (pcVar3 == (char *)0x0) {
        pcVar2 = strstr(pcVar2,"UTF");
        wVar1 = (uint)(pcVar2 != (char *)0x0);
      }
    }
  }
  fl_utf8locale::ret = wVar1;
  return fl_utf8locale::ret;
}

Assistant:

int fl_utf8locale(void) {
  static int ret = 2;
  if (ret == 2) {
#ifdef WIN32
    ret = GetACP() == CP_UTF8;
#else
    char* s;
    ret = 1; /* assume UTF-8 if no locale */
    if (((s = getenv("LC_CTYPE")) && *s) ||
	((s = getenv("LC_ALL"))   && *s) ||
	((s = getenv("LANG"))     && *s)) {
      ret = (strstr(s,"utf") || strstr(s,"UTF"));
    }
#endif
  }
  return ret;
}